

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptNativeIntArray::SetItem
          (JavascriptNativeIntArray *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  bool bVar1;
  TypeId TVar2;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  double local_30;
  double dValue;
  int32 iValue;
  
  bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  }
  else {
    this_00 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
  }
  if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  TVar2 = TrySetNativeIntArrayItem(this,value,(int32 *)((long)&dValue + 4),&local_30);
  if (TVar2 == TypeIds_ArrayLast) {
    JavascriptArray::DirectSetItemAt<double>((JavascriptArray *)this,index,local_30);
  }
  else if (TVar2 == TypeIds_NativeIntArray) {
    SetItem(this,index,dValue._4_4_);
  }
  else {
    JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)this,index,value);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeIntArray::SetItem(uint32 index, Var value, PropertyOperationFlags flags)
    {
        int32 iValue;
        double dValue;
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        TypeId typeId = this->TrySetNativeIntArrayItem(value, &iValue, &dValue);
        if (typeId == TypeIds_NativeIntArray)
        {
            this->SetItem(index, iValue);
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            reinterpret_cast<JavascriptNativeFloatArray*>(this)->DirectSetItemAt<double>(index, dValue);
        }
        else
        {
            this->DirectSetItemAt<Var>(index, value);
        }

        return TRUE;
    }